

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O2

void __thiscall
util::exception::exception<char_const(&)[25],unsigned_char&,char_const(&)[2]>
          (exception *this,char (*args) [25],uchar *args_1,char (*args_2) [2])

{
  char (*in_R8) [2];
  string local_30;
  
  make_string<char_const(&)[25],unsigned_char&,char_const(&)[2]>
            (&local_30,(util *)args,(char (*) [25])args_1,(uchar *)args_2,in_R8);
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  *(undefined ***)this = &PTR__runtime_error_001dcc58;
  return;
}

Assistant:

explicit exception(Args&& ... args)
        : std::runtime_error(make_string(std::forward<Args>(args)...)) {}